

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_config_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_65e8d::Av1Config_ReadInvalidInputs_Test::~Av1Config_ReadInvalidInputs_Test
          (Av1Config_ReadInvalidInputs_Test *this)

{
  void *in_RDI;
  
  ~Av1Config_ReadInvalidInputs_Test((Av1Config_ReadInvalidInputs_Test *)0x3b2638);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(Av1Config, ReadInvalidInputs) {
  Av1Config av1_config;
  memset(&av1_config, 0, sizeof(av1_config));
  size_t bytes_read = 0;
  ASSERT_EQ(-1, read_av1config(nullptr, 0, nullptr, nullptr));
  ASSERT_EQ(-1, read_av1config(nullptr, 4, nullptr, nullptr));
  ASSERT_EQ(-1, read_av1config(&kAv1cAllZero[0], 0, nullptr, nullptr));
  ASSERT_EQ(-1, read_av1config(&kAv1cAllZero[0], 4, &bytes_read, nullptr));
  ASSERT_EQ(-1, read_av1config(nullptr, 4, &bytes_read, &av1_config));
}